

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O0

uint64_t sx_tm_round_to_common_refresh_rate(uint64_t duration)

{
  uint64_t uVar1;
  uint64_t duration_local;
  
  uVar1 = stm_round_to_common_refresh_rate(duration);
  return uVar1;
}

Assistant:

uint64_t sx_tm_round_to_common_refresh_rate(uint64_t duration)
{
    return stm_round_to_common_refresh_rate(duration);
}